

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O3

bool __thiscall
leveldb_filterpolicy_t::KeyMayMatch(leveldb_filterpolicy_t *this,Slice *key,Slice *filter)

{
  uint8_t uVar1;
  
  uVar1 = (*this->key_match_)(this->state_,key->data_,key->size_,filter->data_,filter->size_);
  return uVar1 != '\0';
}

Assistant:

bool KeyMayMatch(const Slice& key, const Slice& filter) const override {
    return (*key_match_)(state_, key.data(), key.size(), filter.data(),
                         filter.size());
  }